

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O0

void __thiscall Assimp::JSONWriter::StartObj(JSONWriter *this,bool is_element)

{
  bool is_element_local;
  JSONWriter *this_local;
  
  if ((is_element) && (AddIndentation(this), (this->first & 1U) == 0)) {
    std::operator<<((ostream *)&this->field_0x58,',');
  }
  this->first = true;
  std::operator<<((ostream *)&this->field_0x58,"{\n");
  PushIndent(this);
  return;
}

Assistant:

void StartObj(bool is_element = false) {
        // if this appears as a plain array element, we need to insert a delimiter and we should also indent it
        if (is_element) {
            AddIndentation();
            if (!first) {
                buff << ',';
            }
        }
        first = true;
        buff << "{\n";
        PushIndent();
    }